

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xss.cpp
# Opt level: O1

bool __thiscall cppcms::xss::uri_parser::dec_octet(uri_parser *this)

{
  byte *pbVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  
  pbVar1 = (byte *)this->begin_;
  if (pbVar1 == (byte *)this->end_) {
    uVar4 = 0;
    iVar3 = 0;
  }
  else {
    iVar3 = 0;
    uVar4 = 0;
    do {
      if ((9 < (byte)(*pbVar1 - 0x30)) || (2 < uVar4)) break;
      uVar4 = uVar4 + 1;
      iVar3 = (uint)*pbVar1 + iVar3 * 10 + -0x30;
    } while (pbVar1 != (byte *)this->end_);
  }
  if ((uVar4 == 0) || (iVar3 < 10 && uVar4 != 1)) {
    bVar2 = false;
  }
  else {
    bVar2 = iVar3 < 0x100 && (uVar4 == 2 || 99 < iVar3);
  }
  this->begin_ = (char *)pbVar1;
  return bVar2;
}

Assistant:

save_point(uri_parser *self) : 
				self_(self) ,
				sp_(self_->begin_)
			{
			}